

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

void __thiscall LASinterval::merge_intervals(LASinterval *this,U32 maximum_intervals)

{
  LASintervalCell *pLVar1;
  uint uVar2;
  bool bVar3;
  U32 UVar4;
  size_type sVar5;
  reference ppVar6;
  reference ppVar7;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_120;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_118;
  LASintervalStartCell *local_110;
  LASintervalStartCell *start_cell;
  _Self local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  uint local_e4;
  pair<const_unsigned_int,_LASintervalCell_*> local_e0;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  uint local_b4;
  iterator iStack_b0;
  U32 size;
  iterator map_element;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_> local_a0;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_98;
  _Base_ptr local_90;
  pair<const_unsigned_int,_LASintervalCell_*> local_78;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_68;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> local_60;
  iterator hash_element;
  my_cell_map map;
  LASintervalCell *delete_cell;
  LASintervalCell *cell;
  U32 diff;
  U32 maximum_intervals_local;
  LASinterval *this_local;
  
  cell._0_4_ = 0;
  cell._4_4_ = maximum_intervals;
  _diff = this;
  UVar4 = get_number_cells(this);
  if (maximum_intervals < UVar4) {
    cell._4_4_ = 0;
  }
  else {
    UVar4 = get_number_cells(this);
    cell._4_4_ = cell._4_4_ - UVar4;
  }
  std::
  multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
  ::multimap((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
              *)&hash_element);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
       ::begin((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
                *)this->cells);
  while( true ) {
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
         ::end((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
                *)this->cells);
    bVar3 = std::__detail::operator!=(&local_60,&local_68);
    if (!bVar3) break;
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>
                         *)&local_60);
    for (delete_cell = &ppVar7->second->super_LASintervalCell;
        delete_cell->next != (LASintervalCell *)0x0; delete_cell = delete_cell->next) {
      cell._0_4_ = ~delete_cell->end + delete_cell->next->start;
      std::pair<const_unsigned_int,_LASintervalCell_*>::
      pair<unsigned_int_&,_LASintervalCell_*&,_true>(&local_78,(uint *)&cell,&delete_cell);
      local_90 = (_Base_ptr)
                 std::
                 multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                 ::insert((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                           *)&hash_element,&local_78);
    }
    local_98._M_cur =
         (__node_type *)
         std::__detail::_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::
         operator++((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false> *)
                    &local_60,0);
  }
  sVar5 = std::
          multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
          ::size((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                  *)&hash_element);
  if (cell._4_4_ < sVar5) {
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::_Rb_tree_iterator
              (&stack0xffffffffffffff50);
    sVar5 = std::
            multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
            ::size((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                    *)&hash_element);
    local_b4 = (uint)sVar5;
    while (cell._4_4_ < local_b4) {
      local_c0 = (_Base_ptr)
                 std::
                 multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                 ::begin((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                          *)&hash_element);
      iStack_b0 = (iterator)local_c0;
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::operator*
                         (&stack0xffffffffffffff50);
      cell._0_4_ = ppVar6->first;
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::operator*
                         (&stack0xffffffffffffff50);
      delete_cell = ppVar6->second;
      local_c8 = iStack_b0._M_node;
      local_d0 = (_Base_ptr)
                 std::
                 multimap<unsigned_int,LASintervalCell*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                 ::erase_abi_cxx11_((multimap<unsigned_int,LASintervalCell*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                                     *)&hash_element,iStack_b0);
      if ((delete_cell->start == 1) && (delete_cell->end == 0)) {
        this->number_intervals = this->number_intervals - 1;
        if (delete_cell != (LASintervalCell *)0x0) {
          operator_delete(delete_cell);
        }
      }
      else {
        pLVar1 = delete_cell->next;
        delete_cell->end = pLVar1->end;
        delete_cell->next = pLVar1->next;
        if (delete_cell->next == (LASintervalCell *)0x0) {
          this->number_intervals = this->number_intervals - 1;
          if (pLVar1 != (LASintervalCell *)0x0) {
            operator_delete(pLVar1);
          }
        }
        else {
          local_e4 = ~delete_cell->end + delete_cell->next->start;
          std::pair<const_unsigned_int,_LASintervalCell_*>::
          pair<unsigned_int,_LASintervalCell_*&,_true>(&local_e0,&local_e4,&delete_cell);
          local_f0 = (_Base_ptr)
                     std::
                     multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                     ::insert((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                               *)&hash_element,&local_e0);
          pLVar1->start = 1;
          pLVar1->end = 0;
        }
        local_b4 = local_b4 - 1;
      }
    }
    local_f8 = (_Base_ptr)
               std::
               multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
               ::begin((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                        *)&hash_element);
    iStack_b0 = (iterator)local_f8;
    while( true ) {
      local_100._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
           ::end((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                  *)&hash_element);
      bVar3 = std::operator==(&stack0xffffffffffffff50,&local_100);
      if (bVar3) break;
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::operator*
                         (&stack0xffffffffffffff50);
      delete_cell = ppVar6->second;
      if (((delete_cell->start == 1) && (delete_cell->end == 0)) &&
         (this->number_intervals = this->number_intervals - 1, delete_cell != (LASintervalCell *)0x0
         )) {
        operator_delete(delete_cell);
      }
      start_cell = (LASintervalStartCell *)
                   std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::
                   operator++(&stack0xffffffffffffff50,0);
    }
    LASMessage(LAS_VERBOSE,"largest interval gap increased to %u",(ulong)(uint)cell);
    local_118._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
         ::begin((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
                  *)this->cells);
    local_60._M_cur = local_118._M_cur;
    while( true ) {
      local_120._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
           ::end((unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
                  *)this->cells);
      bVar3 = std::__detail::operator!=(&local_60,&local_120);
      if (!bVar3) break;
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::operator*
                         ((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>
                           *)&local_60);
      local_110 = ppVar7->second;
      local_110->total = 0;
      for (delete_cell = &local_110->super_LASintervalCell; delete_cell != (LASintervalCell *)0x0;
          delete_cell = delete_cell->next) {
        local_110->total = (delete_cell->end - delete_cell->start) + 1 + local_110->total;
      }
      std::__detail::_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false> *)
                 &local_60,0);
    }
    map_element._M_node._4_4_ = 0;
  }
  else {
    sVar5 = std::
            multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
            ::size((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                    *)&hash_element);
    if (sVar5 == 0) {
      LASMessage(LAS_VERBOSE,"maximum_intervals: %u number of interval gaps: 0 ",(ulong)cell._4_4_);
    }
    else {
      local_a0._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
           ::begin((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                    *)&hash_element);
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::operator*
                         (&local_a0);
      uVar2 = cell._4_4_;
      cell._0_4_ = ppVar6->first;
      sVar5 = std::
              multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
              ::size((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                      *)&hash_element);
      LASMessage(LAS_VERBOSE,
                 "maximum_intervals: %u number of interval gaps: %u next largest interval gap %u",
                 (ulong)uVar2,sVar5 & 0xffffffff,(ulong)(uint)cell);
    }
    map_element._M_node._4_4_ = 1;
  }
  std::
  multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
  ::~multimap((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
               *)&hash_element);
  return;
}

Assistant:

void LASinterval::merge_intervals(U32 maximum_intervals)
{
  U32 diff = 0;
  LASintervalCell* cell;
  LASintervalCell* delete_cell;

  // each cell has minimum one interval

  if (maximum_intervals < get_number_cells())
  {
    maximum_intervals = 0;
  }
  else
  {
    maximum_intervals -= get_number_cells();
  }

  // order intervals by smallest gap

  my_cell_map map;
  my_cell_hash::iterator hash_element = ((my_cell_hash*)cells)->begin();
  while (hash_element != ((my_cell_hash*)cells)->end())
  {
    cell = (*hash_element).second;
    while (cell->next)
    {
      diff = cell->next->start - cell->end - 1;
      map.insert(my_cell_map::value_type(diff, cell));
      cell = cell->next;
    }
    hash_element++;
  }

  // maybe nothing to do
  if (map.size() <= maximum_intervals)
  {
    if (map.size() == 0)
    {
      LASMessage(LAS_VERBOSE, "maximum_intervals: %u number of interval gaps: 0 ", maximum_intervals);
    }
    else
    {
      diff = (*(map.begin())).first;
      LASMessage(LAS_VERBOSE,"maximum_intervals: %u number of interval gaps: %u next largest interval gap %u", maximum_intervals, (U32)map.size(), diff);
    }
    return;
  }

  my_cell_map::iterator map_element;
  U32 size = (U32)map.size();

  while (size > maximum_intervals)
  {
    map_element = map.begin();
    diff = (*map_element).first;
    cell = (*map_element).second;
    map.erase(map_element);
    if ((cell->start == 1) && (cell->end == 0)) // the (start == 1 && end == 0) signals that the cell is to be deleted
    {
      number_intervals--;
      delete cell;
    }
    else
    {
#pragma warning(push)
#pragma warning(disable : 28182)
      delete_cell = cell->next;
      cell->end = delete_cell->end;
      cell->next = delete_cell->next;
#pragma warning(pop)
      if (cell->next)
      {
        map.insert(my_cell_map::value_type(cell->next->start - cell->end - 1, cell));
        delete_cell->start = 1; delete_cell->end = 0; // the (start == 1 && end == 0) signals that the cell is to be deleted
      }
      else
      {
        number_intervals--;
        delete delete_cell;
      }
      size--;
    }
  }
  map_element = map.begin();
  while (true)
  {
    if (map_element == map.end()) break;
    cell = (*map_element).second;
    if ((cell->start == 1) && (cell->end == 0)) // the (start == 1 && end == 0) signals that the cell is to be deleted
    {
      number_intervals--;
      delete cell;
    }
    map_element++;
  }
  LASMessage(LAS_VERBOSE, "largest interval gap increased to %u", diff);

  // update totals

  LASintervalStartCell* start_cell;
  hash_element = ((my_cell_hash*)cells)->begin();
  while (hash_element != ((my_cell_hash*)cells)->end())
  {
    start_cell = (*hash_element).second;
    start_cell->total = 0;
    cell = start_cell;
    while (cell)
    {
      start_cell->total += (cell->end - cell->start + 1);
      cell = cell->next;
    }
    hash_element++;
  }
}